

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LZString.cpp
# Opt level: O3

wstring * __thiscall
lzstring::LZString::DeCompress_abi_cxx11_
          (wstring *__return_storage_ptr__,LZString *this,int length,int resetValue,
          GetNextCharFunc *func)

{
  wchar_t wVar1;
  uint uVar2;
  undefined8 uVar3;
  uint uVar4;
  uint uVar5;
  wchar_t wVar6;
  _Any_data *p_Var7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar12;
  size_t i;
  long lVar13;
  double dVar14;
  __string_type __str;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  dict;
  wstring w;
  wstring entry;
  wstring result;
  int local_f4;
  wchar_t local_f0;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_e8;
  wchar_t local_c8;
  int local_c4;
  wstring *local_c0;
  _Any_data *local_b8;
  int local_ac;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  local_a8;
  value_type local_90;
  undefined4 *local_70;
  undefined8 local_68;
  undefined4 local_60;
  undefined4 uStack_5c;
  undefined4 *local_50;
  undefined8 local_48;
  undefined4 local_40;
  undefined4 uStack_3c;
  
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70 = &local_60;
  local_68 = 0;
  local_60 = 0;
  local_50 = &local_40;
  local_48 = 0;
  local_40 = 0;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = L'\0';
  local_e8._M_dataplus._M_p = local_e8._M_dataplus._M_p & 0xffffffff00000000;
  local_c0 = __return_storage_ptr__;
  local_ac = length;
  if ((func->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0010803a;
  local_b8 = (_Any_data *)func;
  wVar1 = (*func->_M_invoker)((_Any_data *)func,(int *)&local_e8);
  lVar13 = 0;
  do {
    __gnu_cxx::__to_xstring<std::__cxx11::wstring,wchar_t>(&local_e8,vswprintf,0x20,L"%lu",lVar13);
    std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>::
    emplace_back<std::__cxx11::wstring>
              ((vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>> *)&local_a8,
               &local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity * 4 + 4);
    }
    lVar13 = lVar13 + 1;
  } while (lVar13 != 3);
  uVar5 = 0;
  local_f4 = 1;
  uVar10 = 1;
  uVar8 = resetValue;
  do {
    if (uVar8 < 2) {
      local_e8._M_dataplus._M_p._0_4_ = local_f4;
      if (*(long *)(local_b8 + 1) == 0) goto LAB_00108035;
      local_f0 = (**(code **)(local_b8->_M_pod_data + 0x18))(local_b8,(int *)&local_e8);
      local_f4 = local_f4 + 1;
      uVar4 = resetValue;
    }
    else {
      uVar4 = (int)uVar8 >> 1;
      local_f0 = wVar1;
    }
    p_Var7 = local_b8;
    uVar2 = 0;
    if (0 < (uVar8 & wVar1)) {
      uVar2 = uVar10;
    }
    uVar5 = uVar5 | uVar2;
    uVar10 = uVar10 * 2;
    uVar8 = uVar4;
    wVar1 = local_f0;
  } while (uVar10 != 4);
  if (uVar5 == 0) {
    iVar9 = 1;
    do {
      if (uVar4 < 2) {
        local_e8._M_dataplus._M_p._0_4_ = local_f4;
        if (*(long *)(p_Var7 + 1) == 0) goto LAB_00108035;
        local_f0 = (**(code **)(p_Var7->_M_pod_data + 0x18))(p_Var7,(int *)&local_e8);
        local_f4 = local_f4 + 1;
        uVar4 = resetValue;
      }
      else {
        uVar4 = (int)uVar4 >> 1;
      }
      iVar9 = iVar9 * 2;
    } while (iVar9 != 0x100);
  }
  else {
    if (uVar5 == 2) {
      (local_c0->_M_dataplus)._M_p = (pointer)&local_c0->field_2;
      std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_c0,L"");
      goto LAB_00107b52;
    }
    if (uVar5 == 1) {
      iVar9 = 1;
      do {
        if (uVar4 < 2) {
          local_e8._M_dataplus._M_p._0_4_ = local_f4;
          if (*(long *)(p_Var7 + 1) == 0) goto LAB_00108035;
          local_f0 = (**(code **)(p_Var7->_M_pod_data + 0x18))(p_Var7,(int *)&local_e8);
          local_f4 = local_f4 + 1;
          uVar4 = resetValue;
        }
        else {
          uVar4 = (int)uVar4 >> 1;
        }
        iVar9 = iVar9 * 2;
      } while (iVar9 != 0x10000);
    }
  }
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  local_c8 = local_f0;
  std::__cxx11::wstring::_M_construct((ulong)&local_e8,L'\x01');
  std::__cxx11::wstring::operator=((wstring *)&local_90,(wstring *)&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity * 4 + 4);
  }
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::push_back(&local_a8,&local_90);
  std::__cxx11::wstring::push_back((wchar_t)&local_50);
  if (local_f4 <= local_ac) {
    local_f0 = 4;
    iVar9 = 3;
    do {
      dVar14 = ldexp(1.0,iVar9);
      wVar1 = local_c8;
      local_c4 = iVar9;
      if ((int)dVar14 == 1) {
LAB_00107cba:
        iVar9 = 1;
        do {
          if (uVar4 < 2) {
            local_e8._M_dataplus._M_p._0_4_ = local_f4;
            if (*(long *)(p_Var7 + 1) == 0) goto LAB_00108030;
            wVar1 = (**(code **)(p_Var7->_M_pod_data + 0x18))(p_Var7,(int *)&local_e8);
            local_f4 = local_f4 + 1;
            uVar4 = resetValue;
          }
          else {
            uVar4 = (int)uVar4 >> 1;
          }
          iVar9 = iVar9 * 2;
        } while (iVar9 != 0x100);
        uVar11 = (long)local_a8.
                       super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_a8.
                       super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        std::__cxx11::wstring::_M_construct((ulong)&local_e8,L'\x01');
        std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>::
        emplace_back<std::__cxx11::wstring>
                  ((vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>> *)&local_a8,
                   &local_e8);
        iVar9 = local_c4;
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity * 4 + 4);
        }
        local_f0 = local_f0 + -1;
        uVar5 = (uint)(uVar11 >> 5);
      }
      else {
        uVar5 = 0;
        uVar10 = 1;
        wVar6 = local_c8;
        uVar8 = uVar4;
        do {
          if (uVar8 < 2) {
            local_e8._M_dataplus._M_p._0_4_ = local_f4;
            if (*(long *)(local_b8 + 1) == 0) goto LAB_00108035;
            wVar1 = (**(code **)(local_b8->_M_pod_data + 0x18))(local_b8,(int *)&local_e8);
            local_f4 = local_f4 + 1;
            uVar4 = resetValue;
          }
          else {
            uVar4 = (int)uVar8 >> 1;
            wVar1 = wVar6;
          }
          p_Var7 = local_b8;
          uVar2 = 0;
          if (0 < (uVar8 & wVar6)) {
            uVar2 = uVar10;
          }
          uVar5 = uVar5 | uVar2;
          uVar10 = uVar10 * 2;
          wVar6 = wVar1;
          uVar8 = uVar4;
        } while (uVar10 != (int)dVar14);
        if (uVar5 == 0) goto LAB_00107cba;
        if (uVar5 == 1) {
          iVar9 = 1;
          do {
            if (uVar4 < 2) {
              local_e8._M_dataplus._M_p._0_4_ = local_f4;
              if (*(long *)(p_Var7 + 1) == 0) goto LAB_00108030;
              wVar1 = (**(code **)(p_Var7->_M_pod_data + 0x18))(p_Var7,(int *)&local_e8);
              local_f4 = local_f4 + 1;
              uVar4 = resetValue;
            }
            else {
              uVar4 = (int)uVar4 >> 1;
            }
            iVar9 = iVar9 * 2;
          } while (iVar9 != 0x10000);
          uVar11 = (long)local_a8.
                         super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_a8.
                         super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          local_c8 = wVar1;
          std::__cxx11::wstring::_M_construct((ulong)&local_e8,L'\x01');
          std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>::
          emplace_back<std::__cxx11::wstring>
                    ((vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>> *)
                     &local_a8,&local_e8);
          iVar9 = local_c4;
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity * 4 + 4
                           );
          }
          uVar5 = (uint)(uVar11 >> 5);
          local_f0 = local_f0 + -1;
          wVar1 = local_c8;
        }
        else {
          iVar9 = local_c4;
          if (uVar5 == 2) {
            std::__cxx11::wstring::wstring((wstring *)local_c0,(wstring *)&local_50);
            goto LAB_00107b52;
          }
        }
      }
      paVar12 = &local_e8.field_2;
      if (local_f0 == 0) {
        dVar14 = ldexp(1.0,iVar9);
        local_f0 = (wchar_t)dVar14;
        iVar9 = iVar9 + 1;
      }
      uVar11 = (long)local_a8.
                     super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_a8.
                     super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
      local_c8 = wVar1;
      if (uVar11 - 1 < (ulong)(long)(int)uVar5) {
        if (uVar11 != (long)(int)uVar5) {
          (local_c0->_M_dataplus)._M_p = (pointer)&local_c0->field_2;
          local_c0->_M_string_length = 0;
          (local_c0->field_2)._M_local_buf[0] = L'\0';
          goto LAB_00107b52;
        }
        local_e8._M_dataplus._M_p = (pointer)paVar12;
        std::__cxx11::wstring::_M_construct<wchar_t*>
                  ((wstring *)&local_e8,local_90._M_dataplus._M_p,
                   local_90._M_dataplus._M_p + local_90._M_string_length);
        std::__cxx11::wstring::_M_replace_aux((ulong)&local_e8,local_e8._M_string_length,0,L'\x01');
        std::__cxx11::wstring::operator=((wstring *)&local_70,(wstring *)&local_e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_e8._M_dataplus._M_p != paVar12) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity * 4 + 4);
        }
      }
      else {
        std::__cxx11::wstring::_M_assign((wstring *)&local_70);
      }
      std::__cxx11::wstring::_M_append((wchar_t *)&local_50,(ulong)local_70);
      local_e8._M_dataplus._M_p = (pointer)paVar12;
      std::__cxx11::wstring::_M_construct<wchar_t*>
                ((wstring *)&local_e8,local_90._M_dataplus._M_p,
                 local_90._M_dataplus._M_p + local_90._M_string_length);
      std::__cxx11::wstring::_M_replace_aux((ulong)&local_e8,local_e8._M_string_length,0,L'\x01');
      std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>::
      emplace_back<std::__cxx11::wstring>
                ((vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>> *)&local_a8,
                 &local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_e8._M_dataplus._M_p != paVar12) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity * 4 + 4);
      }
      std::__cxx11::wstring::_M_assign((wstring *)&local_90);
      local_f0 = local_f0 + -1;
      if (local_f0 == 0) {
        dVar14 = ldexp(1.0,iVar9);
        local_f0 = (wchar_t)dVar14;
        iVar9 = iVar9 + 1;
      }
    } while (local_f4 <= local_ac);
  }
  (local_c0->_M_dataplus)._M_p = (pointer)&local_c0->field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_c0,L"");
LAB_00107b52:
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT44(local_90.field_2._M_local_buf[1],local_90.field_2._M_local_buf[0]) * 4
                    + 4);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT44(uStack_3c,local_40) * 4 + 4);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT44(uStack_5c,local_60) * 4 + 4);
  }
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::~vector(&local_a8);
  return local_c0;
LAB_00108030:
  std::__throw_bad_function_call();
LAB_00108035:
  std::__throw_bad_function_call();
LAB_0010803a:
  uVar3 = std::__throw_bad_function_call();
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT44(local_90.field_2._M_local_buf[1],local_90.field_2._M_local_buf[0]) * 4
                    + 4);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT44(uStack_3c,local_40) * 4 + 4);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT44(uStack_5c,local_60) * 4 + 4);
  }
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::~vector(&local_a8);
  _Unwind_Resume(uVar3);
}

Assistant:

std::wstring LZString::DeCompress(const int length, const int resetValue, GetNextCharFunc func)
{
	std::vector<std::wstring> dict;
	int enLargeIn = 4;
	int numBits = 3;
	std::wstring entry;
	std::wstring result;
	std::wstring w;
	int bits = 0, resb, maxpower, power;
	wchar_t c = '\0';

	wchar_t dataVal = func(0);
	int dataPosition = resetValue;
	int dataIndex = 1;

	for (size_t i = 0; i < 3; i++)
	{
		dict.push_back(std::to_wstring(i));
	}

	maxpower = (int)pow(2, 2);
	power = 1;
	while (power != maxpower)
	{
		resb = dataVal & dataPosition;
		dataPosition >>= 1;
		if (dataPosition == 0)
		{
			dataPosition = resetValue;
			dataVal = func(dataIndex++);
		}
		bits |= (resb > 0 ? 1 : 0) * power;
		power <<= 1;
	}

	switch (bits)
	{
	case 0:
		bits = 0;
		maxpower = (int)pow(2, 8);
		power = 1;
		while (power != maxpower)
		{
			resb = dataVal & dataPosition;
			dataPosition >>= 1;
			if (dataPosition == 0)
			{
				dataPosition = resetValue;
				dataVal = func(dataIndex++);
			}
			bits |= (resb > 0 ? 1 : 0) * power;
			power <<= 1;
		}
		c = (wchar_t)bits;
		break;
	case 1:
		bits = 0;
		maxpower = (int)pow(2, 16);
		power = 1;
		while (power != maxpower)
		{
			resb = dataVal & dataPosition;
			dataPosition >>= 1;
			if (dataPosition == 0)
			{
				dataPosition = resetValue;
				dataVal = func(dataIndex++);
			}
			bits |= (resb > 0 ? 1 : 0) * power;
			power <<= 1;
		}
		c = (wchar_t)bits;
		break;
	case 2:
		return L"";
	}
	w = std::wstring(1, c);
	dict.push_back(w);
	result.push_back(c);
	while (true)
	{
		if (dataIndex > length)
		{
			return L"";
		}

		bits = 0;
		maxpower = (int)pow(2, numBits);
		power = 1;
		while (power != maxpower)
		{
			resb = dataVal & dataPosition;
			dataPosition >>= 1;
			if (dataPosition == 0)
			{
				dataPosition = resetValue;
				dataVal = func(dataIndex++);
			}
			bits |= (resb > 0 ? 1 : 0) * power;
			power <<= 1;
		}

		int c2;
		switch (c2 = bits)
		{
		case (wchar_t)0:
			bits = 0;
			maxpower = (int)pow(2, 8);
			power = 1;
			while (power != maxpower)
			{
				resb = dataVal & dataPosition;
				dataPosition >>= 1;
				if (dataPosition == 0)
				{
					dataPosition = resetValue;
					dataVal = func(dataIndex++);
				}
				bits |= (resb > 0 ? 1 : 0) * power;
				power <<= 1;
			}

			c2 = dict.size();
			dict.push_back(std::wstring(1, (wchar_t)bits));
			enLargeIn--;
			break;
		case (wchar_t)1:
			bits = 0;
			maxpower = (int)pow(2, 16);
			power = 1;
			while (power != maxpower)
			{
				resb = dataVal & dataPosition;
				dataPosition >>= 1;
				if (dataPosition == 0)
				{
					dataPosition = resetValue;
					dataVal = func(dataIndex++);
				}
				bits |= (resb > 0 ? 1 : 0) * power;
				power <<= 1;
			}

			c2 = dict.size();
			dict.push_back(std::wstring(1, (wchar_t)bits));
			enLargeIn--;
			break;
		case (wchar_t)2:
			return result;
		}

		if (enLargeIn == 0)
		{
			enLargeIn = (int)pow(2, numBits);
			numBits++;
		}

		if (dict.size() - 1 >= c2)
		{
			entry = dict[c2];
		}
		else
		{
			if (c2 == dict.size())
			{
				entry = w + w[0];
			}
			else
			{
				return std::wstring();
			}
		}

		result += entry;

		// Add w+entry[0] to the dictionary
		dict.push_back(w + entry[0]);
		enLargeIn--;

		w = entry;

		if (enLargeIn == 0)
		{
			enLargeIn = (int)pow(2, numBits);
			numBits++;
		}
	}
}